

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::PrintWithFallback<ktx::SelectorRange>(SelectorRange *value,ostream *os)

{
  SelectorRange *in_RSI;
  ostream *in_stack_ffffffffffffffe8;
  
  RawBytesPrinter::PrintValue<ktx::SelectorRange,24ul>(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}